

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t archive_match_include_pattern(archive *_a,char *pattern)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_include_pattern");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    if ((pattern != (char *)0x0) && (*pattern != '\0')) {
      wVar2 = add_pattern_mbs((archive_match *)_a,(match_list *)&_a[1].error_string,pattern);
      return wVar2;
    }
    archive_set_error(_a,0x16,"pattern is empty");
    wVar2 = L'\xffffffe7';
  }
  return wVar2;
}

Assistant:

int
archive_match_include_pattern(struct archive *_a, const char *pattern)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_include_pattern");
	a = (struct archive_match *)_a;

	if (pattern == NULL || *pattern == '\0') {
		archive_set_error(&(a->archive), EINVAL, "pattern is empty");
		return (ARCHIVE_FAILED);
	}
	if ((r = add_pattern_mbs(a, &(a->inclusions), pattern)) != ARCHIVE_OK)
		return (r);
	return (ARCHIVE_OK);
}